

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O3

bool __thiscall
BamTools::BamAlignmentChecker::checkAlignmentTag
          (BamAlignmentChecker *this,PropertyFilterValue *valueFilter,BamAlignment *al)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  size_type sVar5;
  bool bVar6;
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pIVar7;
  ImplBase *pIVar8;
  size_t sVar9;
  ValueCompareType compareType;
  int8_t asciiQueryValue;
  int8_t asciiFilterValue;
  char tagType;
  PropertyFilterValue tagFilter;
  char *pTagData;
  Variant entireTagFilter;
  float realQueryValue;
  float realFilterValue;
  uint32_t uintQueryValue;
  uint32_t uintFilterValue;
  int32_t intQueryValue;
  int32_t intFilterValue;
  uint numBytesParsed;
  uint tagDataLength;
  string tagFilterString;
  string stringQueryValue;
  string stringFilterValue;
  ValueCompareType local_118;
  char local_113;
  char local_112;
  byte local_111;
  PropertyFilterValue local_110;
  Variant local_100;
  Variant local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  uint local_e0;
  uint local_dc [3];
  int local_d0;
  uint local_cc;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_f8.data = (valueFilter->Value).data;
  if (local_f8.data != (ImplBase *)0x0) {
    (local_f8.data)->refs = (local_f8.data)->refs + 1;
  }
  bVar6 = Variant::is_type<std::__cxx11::string>(&local_f8);
  if ((!bVar6) ||
     (pIVar7 = Variant::CastFromBase<std::__cxx11::string>(local_f8.data),
     (pIVar7->data)._M_string_length < 4)) {
    bVar6 = false;
    goto LAB_0016223d;
  }
  std::__cxx11::string::substr((ulong)&local_c8,(ulong)&pIVar7->data);
  local_111 = 0;
  bVar6 = BamAlignment::GetTagType(al,&local_c8,(char *)&local_111);
  if (!bVar6) {
    bVar6 = false;
    goto LAB_00162823;
  }
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)&pIVar7->data);
  paVar2 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_110.Value.data = (ImplBase *)0x0;
  local_110.Type = EXACT;
  local_88._M_dataplus._M_p = (pointer)paVar3;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  if (0x59 < local_111) {
    if (local_111 < 0x66) {
      if (local_111 == 0x5a) goto switchD_00162310_caseD_48;
      if (local_111 == 99) goto LAB_001623e8;
      goto switchD_00162310_caseD_42;
    }
    if (local_111 == 0x66) {
      bVar6 = BamAlignment::GetTag<float>(al,&local_c8,&local_e8);
      if ((!bVar6) ||
         (bVar6 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<float>
                            (&local_a8,&local_e4,&local_118), !bVar6)) goto LAB_001627d1;
      local_ec = local_e4;
      pIVar8 = (ImplBase *)operator_new(0x18);
      pIVar8->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f1048;
      *(float *)&pIVar8[1]._vptr_ImplBase = local_ec;
      pIVar8->refs = 2;
      if (local_110.Value.data != (ImplBase *)0x0) {
        psVar1 = &(local_110.Value.data)->refs;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          (*(local_110.Value.data)->_vptr_ImplBase[1])();
        }
      }
      psVar1 = &pIVar8->refs;
      *psVar1 = *psVar1 - 1;
      local_110.Value.data = pIVar8;
      if (*psVar1 == 0) {
        (*pIVar8->_vptr_ImplBase[1])(pIVar8);
      }
      local_110.Type = local_118;
      bVar6 = PropertyFilterValue::check<float>(&local_110,&local_e8);
      goto LAB_001627d3;
    }
    if ((local_111 != 0x69) && (local_111 != 0x73)) goto switchD_00162310_caseD_42;
LAB_001623e8:
    if (((al->SupportData).HasCoreOnly == false) &&
       (sVar5 = (al->TagData)._M_string_length, sVar5 != 0)) {
      local_100.data = (ImplBase *)(al->TagData)._M_dataplus._M_p;
      local_cc = (uint)sVar5;
      local_d0 = 0;
      bVar6 = BamAlignment::FindTag(al,&local_c8,(char **)&local_100,&local_cc,(uint *)&local_d0);
      if (bVar6) {
        bVar4 = *(byte *)((long)&local_100.data[-1].refs + 7);
        if (bVar4 < 0x69) {
          sVar9 = 1;
          if ((bVar4 != 0x41) && (bVar4 != 99)) goto LAB_001627d1;
        }
        else if (bVar4 == 0x69) {
          sVar9 = 4;
        }
        else {
          if (bVar4 != 0x73) goto LAB_001627d1;
          sVar9 = 2;
        }
        local_dc[1] = 0;
        memcpy(local_dc + 1,local_100.data,sVar9);
        bVar6 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<int>
                          (&local_a8,(int *)(local_dc + 2),&local_118);
        if (bVar6) {
          pIVar8 = (ImplBase *)operator_new(0x18);
          pIVar8->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f30;
          *(uint *)&pIVar8[1]._vptr_ImplBase = local_dc[2];
          pIVar8->refs = 2;
          if (local_110.Value.data != (ImplBase *)0x0) {
            psVar1 = &(local_110.Value.data)->refs;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              (*(local_110.Value.data)->_vptr_ImplBase[1])();
            }
          }
          psVar1 = &pIVar8->refs;
          *psVar1 = *psVar1 - 1;
          local_110.Value.data = pIVar8;
          if (*psVar1 == 0) {
            (*pIVar8->_vptr_ImplBase[1])(pIVar8);
          }
          local_110.Type = local_118;
          bVar6 = PropertyFilterValue::check<int>(&local_110,(int *)(local_dc + 1));
          goto LAB_001627d3;
        }
      }
    }
LAB_001627d1:
    bVar6 = false;
    goto LAB_001627d3;
  }
  switch(local_111) {
  case 0x41:
    bVar6 = BamAlignment::GetTag<signed_char>(al,&local_c8,&local_113);
    if ((!bVar6) ||
       (bVar6 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<signed_char>
                          (&local_a8,&local_112,&local_118), !bVar6)) goto LAB_001627d1;
    pIVar8 = (ImplBase *)operator_new(0x18);
    pIVar8->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f1010;
    *(char *)&pIVar8[1]._vptr_ImplBase = local_112;
    pIVar8->refs = 2;
    if (local_110.Value.data != (ImplBase *)0x0) {
      psVar1 = &(local_110.Value.data)->refs;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        (*(local_110.Value.data)->_vptr_ImplBase[1])();
      }
    }
    psVar1 = &pIVar8->refs;
    *psVar1 = *psVar1 - 1;
    local_110.Value.data = pIVar8;
    if (*psVar1 == 0) {
      (*pIVar8->_vptr_ImplBase[1])(pIVar8);
    }
    local_110.Type = local_118;
    bVar6 = PropertyFilterValue::check<signed_char>(&local_110,&local_113);
    break;
  case 0x42:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    goto switchD_00162310_caseD_42;
  case 0x43:
  case 0x49:
switchD_00162310_caseD_43:
    bVar6 = BamAlignment::GetTag<unsigned_int>(al,&local_c8,&local_e0);
    if ((!bVar6) ||
       (bVar6 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<unsigned_int>
                          (&local_a8,local_dc,&local_118), !bVar6)) goto LAB_001627d1;
    pIVar8 = (ImplBase *)operator_new(0x18);
    pIVar8->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f68;
    *(uint *)&pIVar8[1]._vptr_ImplBase = local_dc[0];
    pIVar8->refs = 2;
    if (local_110.Value.data != (ImplBase *)0x0) {
      psVar1 = &(local_110.Value.data)->refs;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        (*(local_110.Value.data)->_vptr_ImplBase[1])();
      }
    }
    psVar1 = &pIVar8->refs;
    *psVar1 = *psVar1 - 1;
    local_110.Value.data = pIVar8;
    if (*psVar1 == 0) {
      (*pIVar8->_vptr_ImplBase[1])(pIVar8);
    }
    local_110.Type = local_118;
    bVar6 = PropertyFilterValue::check<unsigned_int>(&local_110,&local_e0);
    break;
  case 0x48:
switchD_00162310_caseD_48:
    if (((al->SupportData).HasCoreOnly == false) &&
       (sVar5 = (al->TagData)._M_string_length, sVar5 != 0)) {
      local_100.data = (ImplBase *)(al->TagData)._M_dataplus._M_p;
      local_cc = (uint)sVar5;
      local_d0 = 0;
      bVar6 = BamAlignment::FindTag(al,&local_c8,(char **)&local_100,&local_cc,(uint *)&local_d0);
      if (bVar6) {
        sVar9 = strlen((char *)local_100.data);
        local_88._M_string_length = 0;
        *local_88._M_dataplus._M_p = '\0';
        std::__cxx11::string::resize((ulong)&local_88,(char)(sVar9 & 0xffffffff));
        memcpy(local_88._M_dataplus._M_p,local_100.data,sVar9 & 0xffffffff);
        bVar6 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<std::__cxx11::string>
                          (&local_a8,&local_68,&local_118);
        if (bVar6) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_48,local_68._M_dataplus._M_p,
                     local_68._M_dataplus._M_p + local_68._M_string_length);
          Variant::Variant<std::__cxx11::string>(&local_100,&local_48);
          if (local_100.data != (ImplBase *)0x0) {
            (local_100.data)->refs = (local_100.data)->refs + 1;
          }
          if (local_110.Value.data != (ImplBase *)0x0) {
            psVar1 = &(local_110.Value.data)->refs;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              (*(local_110.Value.data)->_vptr_ImplBase[1])(local_110.Value.data);
            }
          }
          local_110.Value.data = local_100.data;
          if (local_100.data != (ImplBase *)0x0) {
            psVar1 = &(local_100.data)->refs;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              (*(local_100.data)->_vptr_ImplBase[1])();
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          local_110.Type = local_118;
          bVar6 = PropertyFilterValue::check(&local_110,&local_88);
          break;
        }
      }
    }
    goto LAB_001627d1;
  default:
    if (local_111 == 0x53) goto switchD_00162310_caseD_43;
    goto switchD_00162310_caseD_42;
  }
LAB_001627d3:
  if (local_110.Value.data != (ImplBase *)0x0) {
    psVar1 = &(local_110.Value.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_110.Value.data)->_vptr_ImplBase[1])();
    }
  }
LAB_001627e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_00162823:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
LAB_0016223d:
  if (local_f8.data != (ImplBase *)0x0) {
    psVar1 = &(local_f8.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_f8.data)->_vptr_ImplBase[1])();
    }
  }
  return bVar6;
switchD_00162310_caseD_42:
  bVar6 = false;
  goto LAB_001627e9;
}

Assistant:

bool checkAlignmentTag(const PropertyFilterValue& valueFilter, const BamAlignment& al)
    {

        // ensure filter contains string data
        Variant entireTagFilter = valueFilter.Value;
        if (!entireTagFilter.is_type<std::string>()) return false;

        // localize string from variant
        const std::string& entireTagFilterString = entireTagFilter.get<std::string>();

        // ensure we have at least "XX:x"
        if (entireTagFilterString.length() < 4) return false;

        // get tagName & lookup in alignment
        // if found, set tagType to tag type character
        // if not found, return false
        const std::string& tagName = entireTagFilterString.substr(0, 2);
        char tagType = '\0';
        if (!al.GetTagType(tagName, tagType)) return false;

        // remove tagName & ':' from beginning tagFilter
        std::string tagFilterString = entireTagFilterString.substr(3);

        // switch on tag type to set tag query value & parse filter token
        int8_t asciiFilterValue, asciiQueryValue;
        int32_t intFilterValue, intQueryValue;
        uint32_t uintFilterValue, uintQueryValue;
        float realFilterValue, realQueryValue;
        std::string stringFilterValue, stringQueryValue;

        PropertyFilterValue tagFilter;
        PropertyFilterValue::ValueCompareType compareType;
        bool keepAlignment = false;
        switch (tagType) {

            // ASCII tag type
            case 'A':
                if (al.GetTag(tagName, asciiQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, asciiFilterValue, compareType)) {
                        tagFilter.Value = asciiFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(asciiQueryValue);
                    }
                }
                break;

            // signed int tag type
            case 'c':
            case 's':
            case 'i':
                if (al.GetTag(tagName, intQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, intFilterValue, compareType)) {
                        tagFilter.Value = intFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(intQueryValue);
                    }
                }
                break;

            // unsigned int tag type
            case 'C':
            case 'S':
            case 'I':
                if (al.GetTag(tagName, uintQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, uintFilterValue, compareType)) {
                        tagFilter.Value = uintFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(uintQueryValue);
                    }
                }
                break;

            // 'real' tag type
            case 'f':
                if (al.GetTag(tagName, realQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, realFilterValue, compareType)) {
                        tagFilter.Value = realFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(realQueryValue);
                    }
                }
                break;

                // string tag type

            case 'Z':
            case 'H':
                if (al.GetTag(tagName, stringQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, stringFilterValue, compareType)) {
                        tagFilter.Value = stringFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(stringQueryValue);
                    }
                }
                break;

            // unknown tag type
            default:
                keepAlignment = false;
        }

        return keepAlignment;
    }